

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

bool TtfUtil::GetComponentGlyphIds
               (void *pSimpleGlyf,int *prgnCompId,size_t cnCompIdTotal,size_t *cnCompId)

{
  ushort uVar1;
  size_t sVar2;
  ushort *puVar3;
  
  if ((*pSimpleGlyf & 0x80) == 0) {
    return false;
  }
  puVar3 = (ushort *)((long)pSimpleGlyf + 10);
  sVar2 = 0;
  do {
    uVar1 = *puVar3;
    prgnCompId[sVar2] = (uint)(ushort)(puVar3[1] << 8 | puVar3[1] >> 8);
    if ((cnCompIdTotal - 1) + (ulong)(cnCompIdTotal == 0) == sVar2) {
      return sVar2 + 1 < cnCompIdTotal;
    }
    puVar3 = (ushort *)
             ((long)puVar3 +
             (ulong)((uVar1 >> 0xc & 0xc | uVar1 >> 10 & 2) + (uVar1 >> 8 & 1) * 2) + 6);
    sVar2 = sVar2 + 1;
  } while ((uVar1 >> 8 & 0x20) != 0);
  *cnCompId = sVar2;
  return true;
}

Assistant:

bool GetComponentGlyphIds(const void * pSimpleGlyf, int * prgnCompId, 
		size_t cnCompIdTotal, size_t & cnCompId)
{
	using namespace Sfnt;
	
	if (GlyfContourCount(pSimpleGlyf) >= 0)
		return false;

	const Sfnt::SimpleGlyph * pGlyph = reinterpret_cast<const Sfnt::SimpleGlyph *>(pSimpleGlyf);
	// for a composite glyph, the special data begins here
	const uint8 * pbGlyph = reinterpret_cast<const uint8 *>(&pGlyph->end_pts_of_contours[0]);

	uint16 GlyphFlags;
	size_t iCurrentComp = 0;
	do 
	{
		GlyphFlags = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		prgnCompId[iCurrentComp++] = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		if (iCurrentComp >= cnCompIdTotal) 
			return false;
		int nOffset = 0;
		nOffset += GlyphFlags & CompoundGlyph::Arg1Arg2Words ? 4 : 2;
		nOffset += GlyphFlags & CompoundGlyph::HaveScale ? 2 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveXAndYScale  ? 4 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveTwoByTwo  ? 8 :  0;
		pbGlyph += nOffset;
	} while (GlyphFlags & CompoundGlyph::MoreComponents);

	cnCompId = iCurrentComp;

	return true;
}